

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool re2::IsValidCaptureName(StringPiece *name)

{
  char cVar1;
  size_type sVar2;
  const_reference pcVar3;
  StringPiece *in_RDI;
  int c;
  size_t i;
  ulong local_18;
  bool local_1;
  
  sVar2 = StringPiece::size(in_RDI);
  if (sVar2 == 0) {
    local_1 = false;
  }
  else {
    for (local_18 = 0; sVar2 = StringPiece::size(in_RDI), local_18 < sVar2; local_18 = local_18 + 1)
    {
      pcVar3 = StringPiece::operator[](in_RDI,local_18);
      cVar1 = *pcVar3;
      if ((((cVar1 < '0') || ('9' < cVar1)) && ((cVar1 < 'a' || ('z' < cVar1)))) &&
         (((cVar1 < 'A' || ('Z' < cVar1)) && (cVar1 != '_')))) {
        return false;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool IsValidCaptureName(const StringPiece& name) {
  if (name.size() == 0)
    return false;
  for (size_t i = 0; i < name.size(); i++) {
    int c = name[i];
    if (('0' <= c && c <= '9') ||
        ('a' <= c && c <= 'z') ||
        ('A' <= c && c <= 'Z') ||
        c == '_')
      continue;
    return false;
  }
  return true;
}